

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfoDebug.cpp
# Opt level: O3

HighsDebugStatus
debugInfo(HighsOptions *options,HighsLp *lp,HighsBasis *basis,HighsSolution *solution,
         HighsInfo *info,HighsModelStatus model_status)

{
  int iVar1;
  int iVar2;
  HighsDebugStatus HVar3;
  char *format;
  
  if ((options->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  if (kMax < model_status) {
    return kOk;
  }
  if ((0x1ff80U >> (model_status & (kSolutionLimit|kUnknown)) & 1) == 0) {
    if ((0x4007fU >> (model_status & (kSolutionLimit|kUnknown)) & 1) == 0) {
      return kOk;
    }
    HVar3 = debugNoInfo(info);
    return HVar3;
  }
  if (solution->value_valid == true) {
    iVar1 = (info->super_HighsInfoStruct).num_primal_infeasibilities;
    if (iVar1 < 0) {
      format = "Have primal solution but num_primal_infeasibilities = %d\n";
      goto LAB_00228f2f;
    }
    iVar2 = (info->super_HighsInfoStruct).primal_solution_status;
    if (iVar1 == 0) {
      if (iVar2 != 2) {
        format = "Have primal solution and no infeasibilities but primal status = %d\n";
        goto LAB_00228f2f;
      }
    }
    else if (iVar2 != 1) {
      format = "Have primal solution and infeasibilities but primal status = %d\n";
      goto LAB_00228f2f;
    }
  }
  else if ((info->super_HighsInfoStruct).primal_solution_status != 0) {
    format = "Have no primal solution but primal status = %d\n";
    goto LAB_00228f2f;
  }
  if (solution->dual_valid == false) {
    if ((info->super_HighsInfoStruct).dual_solution_status == 0) {
      return kOk;
    }
    format = "Have no dual solution but dual status = %d\n";
  }
  else {
    iVar1 = (info->super_HighsInfoStruct).num_dual_infeasibilities;
    if (iVar1 < 0) {
      format = "Have dual solution but num_dual_infeasibilities = %d\n";
    }
    else {
      iVar2 = (info->super_HighsInfoStruct).dual_solution_status;
      if (iVar1 == 0) {
        if (iVar2 == 2) {
          return kOk;
        }
        format = "Have dual solution and no infeasibilities but dual status = %d\n";
      }
      else {
        if (iVar2 == 1) {
          return kOk;
        }
        format = "Have dual solution and infeasibilities but dual status = %d\n";
      }
    }
  }
LAB_00228f2f:
  highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,format);
  return kLogicalError;
}

Assistant:

HighsDebugStatus debugInfo(const HighsOptions& options, const HighsLp& lp,
                           const HighsBasis& basis,
                           const HighsSolution& solution, const HighsInfo& info,
                           const HighsModelStatus model_status) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  HighsDebugStatus call_status;

  const bool have_info = info.valid;
  const bool have_primal_solution = solution.value_valid;
  const bool have_dual_solution = solution.dual_valid;
  const bool have_basis = basis.valid;
  switch (model_status) {
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kModelEmpty:
    case HighsModelStatus::kMemoryLimit:
      // Should have no info, so check this and return
      assert(!have_primal_solution);
      assert(!have_dual_solution);
      assert(!have_basis);
      call_status = debugNoInfo(info);
      if (call_status != HighsDebugStatus::kOk) return_status = call_status;
      return return_status;
    case HighsModelStatus::kOptimal:
    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
    case HighsModelStatus::kUnboundedOrInfeasible:
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kUnknown:
      // Should have info
      assert(have_info == true);
      if (have_primal_solution) {
        if (info.num_primal_infeasibilities < 0) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Have primal solution but num_primal_infeasibilities = "
                      "%" HIGHSINT_FORMAT "\n",
                      info.num_primal_infeasibilities);
          return HighsDebugStatus::kLogicalError;
        } else if (info.num_primal_infeasibilities == 0) {
          if (info.primal_solution_status != kSolutionStatusFeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have primal solution and no infeasibilities but "
                        "primal status = %" HIGHSINT_FORMAT "\n",
                        info.primal_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        } else {
          if (info.primal_solution_status != kSolutionStatusInfeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have primal solution and infeasibilities but primal "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.primal_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        }
      } else {
        if (info.primal_solution_status != kSolutionStatusNone) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Have no primal solution but primal status = %" HIGHSINT_FORMAT
              "\n",
              info.primal_solution_status);
          return HighsDebugStatus::kLogicalError;
        }
      }
      if (have_dual_solution) {
        if (info.num_dual_infeasibilities < 0) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Have dual solution but num_dual_infeasibilities = "
                      "%" HIGHSINT_FORMAT "\n",
                      info.num_dual_infeasibilities);
          return HighsDebugStatus::kLogicalError;
        } else if (info.num_dual_infeasibilities == 0) {
          if (info.dual_solution_status != kSolutionStatusFeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have dual solution and no infeasibilities but dual "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.dual_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        } else {
          if (info.dual_solution_status != kSolutionStatusInfeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have dual solution and infeasibilities but dual "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.dual_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        }
      } else {
        if (info.dual_solution_status != kSolutionStatusNone) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Have no dual solution but dual status = %" HIGHSINT_FORMAT "\n",
              info.dual_solution_status);
          return HighsDebugStatus::kLogicalError;
        }
      }
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }

  return return_status;
}